

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O3

bool ft::operator==(list<int,_ft::allocator<int>_> *lhs,list<int,_ft::allocator<int>_> *rhs)

{
  listNode<int> *plVar1;
  listNode<int> **pplVar2;
  bool bVar3;
  listNode<int> *local_10;
  
  if (lhs->m_size != rhs->m_size) {
    return false;
  }
  plVar1 = lhs->m_head->next;
  local_10 = rhs->m_head->next;
  if (plVar1 == lhs->m_tail) {
    bVar3 = true;
  }
  else {
    pplVar2 = &local_10;
    do {
      bVar3 = plVar1->data == (*pplVar2)->data;
      if (!bVar3) {
        return bVar3;
      }
      plVar1 = plVar1->next;
      pplVar2 = &(*pplVar2)->next;
    } while (plVar1 != lhs->m_tail);
  }
  return bVar3;
}

Assistant:

size_type	size() const { return this->m_size; }